

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O3

void __thiscall
ccs::Key::Key(Key *this,string *name,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *values)

{
  _Rb_tree_header *p_Var1;
  pointer value;
  
  p_Var1 = &(this->values_)._M_t._M_impl.super__Rb_tree_header;
  (this->values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->values_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->specificity_).names = 0;
  (this->specificity_).values = 0;
  addName(this,name);
  for (value = (values->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      value != (values->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish; value = value + 1) {
    addValue(this,name,value);
  }
  return;
}

Assistant:

Key(const std::string &name, const std::vector<std::string> &values) {
    addName(name);
    for (auto it = values.begin(); it != values.end(); ++it)
      addValue(name, *it);
  }